

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

box3f * __thiscall pbrt::Sphere::getPrimBounds(Sphere *this,size_t param_2,affine3f *xfm)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar9;
  undefined4 uVar17;
  box3f *in_RDI;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar31;
  float fVar32;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar54;
  undefined1 auVar53 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar63;
  float fVar64;
  undefined1 auVar62 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar68 [16];
  float fVar72;
  float fVar73;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar74 [16];
  
  fVar18 = (this->transform).l.vx.x;
  fVar24 = (xfm->l).vx.z;
  uVar1 = (this->transform).l.vx.y;
  uVar10 = (this->transform).l.vx.z;
  fVar60 = (xfm->l).vy.z;
  fVar66 = (xfm->l).vz.z;
  fVar59 = (float)uVar10 * fVar66 + fVar18 * fVar24 + (float)uVar1 * fVar60;
  fVar22 = (this->transform).l.vy.x;
  uVar2 = (this->transform).l.vy.y;
  uVar11 = (this->transform).l.vy.z;
  fVar31 = fVar66 * (float)uVar11 + fVar24 * fVar22 + fVar60 * (float)uVar2;
  fVar30 = (this->transform).l.vz.x;
  uVar3 = (this->transform).l.vz.y;
  uVar12 = (this->transform).l.vz.z;
  fVar51 = fVar66 * (float)uVar12 + fVar24 * fVar30 + fVar60 * (float)uVar3;
  uVar4 = (this->transform).p.x;
  uVar13 = (this->transform).p.y;
  fVar47 = (xfm->p).z;
  (in_RDI->lower).x = 3.4028235e+38;
  (in_RDI->lower).y = 3.4028235e+38;
  *(undefined8 *)&(in_RDI->lower).z = 0xff7fffff7f7fffff;
  (in_RDI->upper).y = -3.4028235e+38;
  (in_RDI->upper).z = -3.4028235e+38;
  uVar5 = (xfm->l).vx.x;
  uVar14 = (xfm->l).vx.y;
  uVar6 = (xfm->l).vy.x;
  uVar15 = (xfm->l).vy.y;
  uVar7 = (xfm->l).vz.x;
  uVar16 = (xfm->l).vz.y;
  fVar46 = (float)uVar10 * (float)uVar7 + (float)uVar1 * (float)uVar6 + fVar18 * (float)uVar5;
  fVar48 = (float)uVar10 * (float)uVar16 + (float)uVar1 * (float)uVar15 + fVar18 * (float)uVar14;
  fVar49 = (float)uVar10 * 0.0 + (float)uVar1 * 0.0 + fVar18 * 0.0;
  fVar50 = (float)uVar10 * 0.0 + (float)uVar1 * 0.0 + fVar18 * 0.0;
  fVar41 = (float)uVar11 * (float)uVar7 + (float)uVar2 * (float)uVar6 + fVar22 * (float)uVar5;
  fVar43 = (float)uVar11 * (float)uVar16 + (float)uVar2 * (float)uVar15 + fVar22 * (float)uVar14;
  fVar44 = (float)uVar11 * 0.0 + (float)uVar2 * 0.0 + fVar22 * 0.0;
  fVar45 = (float)uVar11 * 0.0 + (float)uVar2 * 0.0 + fVar22 * 0.0;
  fVar22 = (float)uVar12 * (float)uVar7 + (float)uVar3 * (float)uVar6 + fVar30 * (float)uVar5;
  fVar28 = (float)uVar12 * (float)uVar16 + (float)uVar3 * (float)uVar15 + fVar30 * (float)uVar14;
  fVar29 = (float)uVar12 * 0.0 + (float)uVar3 * 0.0 + fVar30 * 0.0;
  fVar30 = (float)uVar12 * 0.0 + (float)uVar3 * 0.0 + fVar30 * 0.0;
  uVar9 = *(undefined8 *)&(this->transform).p.z;
  fVar18 = (float)uVar9;
  fVar54 = (float)((ulong)uVar9 >> 0x20);
  fVar65 = fVar54 * fVar31;
  uVar8 = (xfm->p).x;
  uVar17 = (xfm->p).y;
  fVar52 = fVar59 * fVar54;
  fVar23 = -fVar54;
  fVar59 = fVar59 * fVar23;
  fVar31 = fVar31 * fVar23;
  fVar72 = fVar51 * fVar23;
  fVar55 = fVar18 * (float)uVar7 + (float)uVar13 * (float)uVar6 + (float)uVar4 * (float)uVar5 +
           (float)uVar8;
  fVar56 = fVar18 * (float)uVar16 + (float)uVar13 * (float)uVar15 + (float)uVar4 * (float)uVar14 +
           (float)uVar17;
  fVar57 = fVar18 * 0.0 + (float)uVar13 * 0.0 + (float)uVar4 * 0.0 + 0.0;
  fVar58 = fVar18 * 0.0 + (float)uVar13 * 0.0 + (float)uVar4 * 0.0 + 0.0;
  fVar32 = fVar46 * fVar23;
  fVar35 = fVar48 * fVar23;
  fVar36 = fVar49 * fVar23;
  fVar37 = fVar50 * fVar23;
  fVar67 = fVar41 * fVar23;
  fVar69 = fVar43 * fVar23;
  fVar70 = fVar44 * fVar23;
  fVar71 = fVar45 * fVar23;
  fVar73 = fVar32 + fVar67;
  fVar75 = fVar35 + fVar69;
  fVar76 = fVar36 + fVar70;
  fVar77 = fVar37 + fVar71;
  fVar61 = fVar23 * fVar22;
  fVar63 = fVar23 * fVar28;
  fVar64 = fVar23 * fVar29;
  fVar23 = fVar23 * fVar30;
  auVar38._0_8_ = CONCAT44(fVar75 + fVar63 + fVar56,fVar73 + fVar61 + fVar55);
  auVar38._8_4_ = fVar76 + fVar64 + fVar57;
  auVar38._12_4_ = fVar77 + fVar23 + fVar58;
  auVar25._8_4_ = auVar38._8_4_;
  auVar25._0_8_ = auVar38._0_8_;
  auVar25._12_4_ = auVar38._12_4_;
  auVar25 = minps(auVar25,_DAT_0014b290);
  auVar38 = maxps(auVar38,_DAT_0014b280);
  fVar22 = fVar22 * fVar54;
  fVar28 = fVar28 * fVar54;
  fVar29 = fVar29 * fVar54;
  fVar30 = fVar30 * fVar54;
  auVar74._0_8_ = CONCAT44(fVar75 + fVar28 + fVar56,fVar73 + fVar22 + fVar55);
  auVar74._8_4_ = fVar76 + fVar29 + fVar57;
  auVar74._12_4_ = fVar77 + fVar30 + fVar58;
  auVar19._8_4_ = auVar74._8_4_;
  auVar19._0_8_ = auVar74._0_8_;
  auVar19._12_4_ = auVar74._12_4_;
  auVar19 = minps(auVar19,auVar25);
  fVar73 = fVar65 + fVar59;
  fVar59 = fVar59 + fVar31;
  fVar65 = fVar65 + fVar52;
  fVar47 = fVar47 + fVar60 * (float)uVar13 + fVar24 * (float)uVar4 + fVar66 * fVar18;
  fVar24 = fVar59 + fVar72 + fVar47;
  fVar18 = fVar24;
  if (3.4028235e+38 <= fVar24) {
    fVar18 = 3.4028235e+38;
  }
  fVar51 = fVar51 * fVar54;
  fVar60 = fVar59 + fVar51 + fVar47;
  fVar66 = fVar60;
  if (fVar18 <= fVar60) {
    fVar66 = fVar18;
  }
  auVar25 = maxps(auVar74,auVar38);
  if (fVar24 <= -3.4028235e+38) {
    fVar24 = -3.4028235e+38;
  }
  if (fVar60 <= fVar24) {
    fVar60 = fVar24;
  }
  fVar41 = fVar41 * fVar54;
  fVar43 = fVar43 * fVar54;
  fVar44 = fVar44 * fVar54;
  fVar45 = fVar45 * fVar54;
  fVar32 = fVar32 + fVar41;
  fVar35 = fVar35 + fVar43;
  fVar36 = fVar36 + fVar44;
  fVar37 = fVar37 + fVar45;
  auVar20._0_8_ = CONCAT44(fVar35 + fVar63 + fVar56,fVar32 + fVar61 + fVar55);
  auVar20._8_4_ = fVar36 + fVar64 + fVar57;
  auVar20._12_4_ = fVar37 + fVar23 + fVar58;
  auVar26._8_4_ = auVar20._8_4_;
  auVar26._0_8_ = auVar20._0_8_;
  auVar26._12_4_ = auVar20._12_4_;
  auVar19 = minps(auVar26,auVar19);
  fVar24 = fVar73 + fVar72 + fVar47;
  fVar18 = fVar24;
  if (fVar66 <= fVar24) {
    fVar18 = fVar66;
  }
  auVar25 = maxps(auVar20,auVar25);
  if (fVar24 <= fVar60) {
    fVar24 = fVar60;
  }
  auVar33._0_8_ = CONCAT44(fVar35 + fVar28 + fVar56,fVar32 + fVar22 + fVar55);
  auVar33._8_4_ = fVar36 + fVar29 + fVar57;
  auVar33._12_4_ = fVar37 + fVar30 + fVar58;
  auVar42._8_4_ = auVar33._8_4_;
  auVar42._0_8_ = auVar33._0_8_;
  auVar42._12_4_ = auVar33._12_4_;
  auVar19 = minps(auVar42,auVar19);
  fVar66 = fVar73 + fVar51 + fVar47;
  fVar60 = fVar66;
  if (fVar18 <= fVar66) {
    fVar60 = fVar18;
  }
  auVar25 = maxps(auVar33,auVar25);
  if (fVar66 <= fVar24) {
    fVar66 = fVar24;
  }
  fVar52 = fVar52 + fVar31;
  fVar46 = fVar54 * fVar46;
  fVar48 = fVar54 * fVar48;
  fVar49 = fVar54 * fVar49;
  fVar54 = fVar54 * fVar50;
  fVar67 = fVar67 + fVar46;
  fVar69 = fVar69 + fVar48;
  fVar70 = fVar70 + fVar49;
  fVar71 = fVar71 + fVar54;
  auVar21._0_8_ = CONCAT44(fVar69 + fVar63 + fVar56,fVar67 + fVar61 + fVar55);
  auVar21._8_4_ = fVar70 + fVar64 + fVar57;
  auVar21._12_4_ = fVar71 + fVar23 + fVar58;
  auVar39._8_4_ = auVar21._8_4_;
  auVar39._0_8_ = auVar21._0_8_;
  auVar39._12_4_ = auVar21._12_4_;
  auVar19 = minps(auVar39,auVar19);
  fVar24 = fVar72 + fVar52 + fVar47;
  fVar18 = fVar24;
  if (fVar60 <= fVar24) {
    fVar18 = fVar60;
  }
  auVar25 = maxps(auVar21,auVar25);
  if (fVar24 <= fVar66) {
    fVar24 = fVar66;
  }
  fVar60 = fVar52 + fVar51 + fVar47;
  auVar68._0_8_ = CONCAT44(fVar69 + fVar28 + fVar56,fVar67 + fVar22 + fVar55);
  auVar68._8_4_ = fVar70 + fVar29 + fVar57;
  auVar68._12_4_ = fVar71 + fVar30 + fVar58;
  auVar27._8_4_ = auVar68._8_4_;
  auVar27._0_8_ = auVar68._0_8_;
  auVar27._12_4_ = auVar68._12_4_;
  auVar19 = minps(auVar27,auVar19);
  fVar66 = fVar60;
  if (fVar18 <= fVar60) {
    fVar66 = fVar18;
  }
  auVar25 = maxps(auVar68,auVar25);
  if (fVar60 <= fVar24) {
    fVar60 = fVar24;
  }
  fVar18 = fVar72 + fVar65 + fVar47;
  fVar46 = fVar46 + fVar41;
  fVar48 = fVar48 + fVar43;
  fVar49 = fVar49 + fVar44;
  fVar54 = fVar54 + fVar45;
  auVar62._0_8_ = CONCAT44(fVar63 + fVar48 + fVar56,fVar61 + fVar46 + fVar55);
  auVar62._8_4_ = fVar64 + fVar49 + fVar57;
  auVar62._12_4_ = fVar23 + fVar54 + fVar58;
  auVar40._8_4_ = auVar62._8_4_;
  auVar40._0_8_ = auVar62._0_8_;
  auVar40._12_4_ = auVar62._12_4_;
  auVar19 = minps(auVar40,auVar19);
  fVar24 = fVar18;
  if (fVar66 <= fVar18) {
    fVar24 = fVar66;
  }
  auVar25 = maxps(auVar62,auVar25);
  if (fVar18 <= fVar60) {
    fVar18 = fVar60;
  }
  fVar47 = fVar65 + fVar51 + fVar47;
  auVar53._0_8_ = CONCAT44(fVar48 + fVar28 + fVar56,fVar46 + fVar22 + fVar55);
  auVar53._8_4_ = fVar49 + fVar29 + fVar57;
  auVar53._12_4_ = fVar54 + fVar30 + fVar58;
  auVar34._8_4_ = auVar53._8_4_;
  auVar34._0_8_ = auVar53._0_8_;
  auVar34._12_4_ = auVar53._12_4_;
  auVar19 = minps(auVar34,auVar19);
  fVar60 = fVar47;
  if (fVar24 <= fVar47) {
    fVar60 = fVar24;
  }
  (in_RDI->lower).x = (float)(int)auVar19._0_8_;
  (in_RDI->lower).y = (float)(int)((ulong)auVar19._0_8_ >> 0x20);
  (in_RDI->lower).z = fVar60;
  auVar19 = maxps(auVar53,auVar25);
  if (fVar47 <= fVar18) {
    fVar47 = fVar18;
  }
  (in_RDI->upper).x = (float)(int)auVar19._0_8_;
  (in_RDI->upper).y = (float)(int)((ulong)auVar19._0_8_ >> 0x20);
  (in_RDI->upper).z = fVar47;
  return in_RDI;
}

Assistant:

box3f Sphere::getPrimBounds(const size_t /*unused: primID*/, const affine3f &xfm) 
  {
    box3f ob(vec3f(-radius),vec3f(+radius));
    affine3f _xfm = xfm * transform;
      
    box3f bounds = box3f::empty_box();
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.upper.z)));
    return bounds;
  }